

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<double,double>::initialize_bdens_ext<InputData<double,long>>
          (DensityCalculator<double,_double> *this,InputData<double,_long> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<double> *col_sampler,bool col_sampler_is_fresh)

{
  byte bVar1;
  bool bVar2;
  double *xmin;
  size_type sVar3;
  size_t end;
  reference col_00;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  size_t in_RDX;
  long *unaff_RBX;
  size_t *in_RSI;
  long in_RDI;
  size_t in_R8;
  byte in_R9B;
  undefined8 unaff_R14;
  double *unaff_retaddr;
  double *in_stack_00000008;
  bool *in_stack_00000010;
  size_t col;
  bool unsplittable;
  value_type_conflict *in_stack_ffffffffffffff18;
  ColumnSampler<double> *in_stack_ffffffffffffff20;
  undefined4 uVar5;
  ColumnSampler<double> *in_stack_ffffffffffffff28;
  ColumnSampler<double> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  MissingAction missing_action;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar6;
  unsigned_long *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  double *local_58;
  byte local_49;
  long *Xc_ind;
  undefined7 in_stack_ffffffffffffffc0;
  
  bVar1 = in_R9B & 1;
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Xc_ind = (long *)0x0;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  if (in_RSI[0x18] == 0) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_49 = 0;
    if (in_RSI[1] != 0) {
      ColumnSampler<double>::prepare_full_pass(in_stack_ffffffffffffff30);
      while (bVar2 = ColumnSampler<double>::sample_col
                               (in_stack_ffffffffffffff28,(size_t *)in_stack_ffffffffffffff20),
            bVar2) {
        if (local_58 < (double *)in_RSI[1]) {
          if (in_RSI[0xd] == 0) {
            xmin = (double *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x32d299);
            missing_action = (MissingAction)(*in_RSI + in_RSI[6] * (long)local_58 * 8 >> 0x20);
            sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RCX);
            end = sVar3 - 1;
            uVar6 = *(undefined4 *)(in_RDX + 0x88);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),
                                (size_type)local_58);
            col_00 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                (size_type)local_58);
            in_stack_ffffffffffffff20 = (ColumnSampler<double> *)&stack0xffffffffffffffb7;
            get_range<double>(in_stack_ffffffffffffff70,pvVar4,
                              CONCAT44(uVar6,in_stack_ffffffffffffff60),end,missing_action,xmin,
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
          }
          else {
            in_stack_ffffffffffffff70 =
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x32d19d);
            uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff20 >> 0x20);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RCX);
            in_stack_ffffffffffffff88 = (bool *)in_RSI[0xb];
            col_00 = (reference)in_RSI[0xd];
            uVar6 = *(undefined4 *)(in_RDX + 0x88);
            in_stack_ffffffffffffff80 = local_58;
            in_stack_ffffffffffffff28 =
                 (ColumnSampler<double> *)
                 std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),
                            (size_type)local_58);
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                       (size_type)local_58);
            in_stack_ffffffffffffff20 = (ColumnSampler<double> *)CONCAT44(uVar5,uVar6);
            get_range<double,long>
                      (in_RSI,in_RDX,(size_t)in_RCX,in_R8,
                       (double *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),Xc_ind,unaff_RBX,
                       (MissingAction)unaff_R14,unaff_retaddr,in_stack_00000008,in_stack_00000010);
          }
          if ((local_49 & 1) != 0) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),
                                (size_type)local_58);
            *pvVar4 = 0.0;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                (size_type)local_58);
            *pvVar4 = 0.0;
            ColumnSampler<double>::drop_col(in_stack_ffffffffffffff20,(size_t)col_00);
          }
        }
      }
    }
  }
  else {
    std::vector<double,std::allocator<double>>::assign<double*,void>
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
               (double *)in_stack_ffffffffffffff28,(double *)in_stack_ffffffffffffff20);
    std::vector<double,std::allocator<double>>::assign<double*,void>
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
               (double *)in_stack_ffffffffffffff28,(double *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens_ext(const InputData &input_data,
                                             const ModelParams &model_params,
                                             std::vector<size_t> &ix_arr,
                                             ColumnSampler<ldouble_safe> &col_sampler,
                                             bool col_sampler_is_fresh)
{
    this->vals_ext_box.reserve(model_params.max_depth + 3);
    this->queue_ext_box.reserve(model_params.max_depth + 3);
    this->vals_ext_box.push_back(0);

    if (input_data.range_low != NULL)
    {
        this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
        this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        return;
    }

    this->box_low.resize(input_data.ncols_numeric);
    this->box_high.resize(input_data.ncols_numeric);
    bool unsplittable = false;

    /* TODO: find out if there's an optimal point for choosing one or the other loop
       when using 'leave_m_cols' and when using 'prob_pick_col_by_range', then fill in the
       lines that are commented out. */
    // if (!input_data.ncols_categ || model_params.ncols_per_tree < input_data.ncols_numeric)
    if (input_data.ncols_numeric)
    {
        col_sampler.prepare_full_pass();
        size_t col;
        while (col_sampler.sample_col(col))
        {
            if (col >= input_data.ncols_numeric)
                continue;
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                col_sampler.drop_col(col);
            }
        }
    }

    // else if (input_data.ncols_numeric)
    // {
    //     size_t n_unsplittable = 0;
    //     std::vector<size_t> unsplittable_cols;
    //     if (col_sampler_is_fresh && !col_sampler.has_weights())
    //         unsplittable_cols.reserve(input_data.ncols_numeric);

    //     /* TODO: this will do unnecessary calculations when using 'leave_m_cols' */
    //     for (size_t col = 0; col < input_data.ncols_numeric; col++)
    //     {
    //         if (input_data.Xc_indptr != NULL)
    //         {
    //             get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
    //                       input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
    //                       model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
    //         }

    //         else
    //         {
    //             get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
    //                       model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
    //         }

    //         if (unsplittable)
    //         {
    //             this->box_low[col] = 0;
    //             this->box_high[col] = 0;
    //             n_unsplittable++;
    //             if (col_sampler.has_weights())
    //                 col_sampler.drop_col(col);
    //             else if (col_sampler_is_fresh)
    //                 unsplittable_cols.push_back(col);
    //         }
    //     }

    //     if (n_unsplittable && col_sampler_is_fresh && !col_sampler.has_weights())
    //     {
    //         #if (__cplusplus >= 202002L)
    //         for (auto col : unsplittable_cols | std::views::reverse)
    //             col_sampler.drop_from_tail(col);
    //         #else
    //         for (size_t inv_col = 0; inv_col < unsplittable_cols.size(); inv_col++)
    //         {
    //             size_t col = unsplittable_cols.size() - inv_col - 1;
    //             col_sampler.drop_from_tail(unsplittable_cols[col]);
    //         }
    //         #endif
    //     }

    //     else if (n_unsplittable > model_params.sample_size / 16 && !col_sampler_is_fresh && !col_sampler.has_weights())
    //     {
    //         /* TODO */
    //     }
    // }
}